

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O2

date_time *
mjs::anon_unknown_37::date_helper::date_time_from_time(date_time *__return_storage_ptr__,double t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  tm tm;
  tm local_48;
  
  tm_from_time(&local_48,t);
  __return_storage_ptr__->year = (double)(local_48.tm_year + 0x76c);
  auVar1._8_4_ = SUB84((double)local_48.tm_mday,0);
  auVar1._0_8_ = (double)local_48.tm_mon;
  auVar1._12_4_ = (int)((ulong)(double)local_48.tm_mday >> 0x20);
  __return_storage_ptr__->month = (double)local_48.tm_mon;
  __return_storage_ptr__->day = (double)auVar1._8_8_;
  auVar2._8_4_ = SUB84((double)local_48.tm_min,0);
  auVar2._0_8_ = (double)local_48.tm_hour;
  auVar2._12_4_ = (int)((ulong)(double)local_48.tm_min >> 0x20);
  __return_storage_ptr__->h = (double)local_48.tm_hour;
  __return_storage_ptr__->m = (double)auVar2._8_8_;
  __return_storage_ptr__->s = (double)local_48.tm_sec;
  __return_storage_ptr__->ms = (double)((long)t % 1000);
  return __return_storage_ptr__;
}

Assistant:

static date_time date_time_from_time(double t) {
        const auto tm = tm_from_time(t);
        return {
            static_cast<double>(tm.tm_year+1900), static_cast<double>(tm.tm_mon), static_cast<double>(tm.tm_mday),
            static_cast<double>(tm.tm_hour), static_cast<double>(tm.tm_min), static_cast<double>(tm.tm_sec), static_cast<double>(ms_from_time(t))
        };
    }